

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Any.hpp
# Opt level: O0

Any __thiscall rc::detail::Any::of<unsigned_long>(Any *this,unsigned_long *value)

{
  AnyImpl<unsigned_long> *this_00;
  unsigned_long *value_local;
  Any *any;
  
  Any(this);
  this_00 = (AnyImpl<unsigned_long> *)operator_new(0x10);
  AnyImpl<unsigned_long>::AnyImpl<unsigned_long>(this_00,value);
  std::unique_ptr<rc::detail::Any::IAnyImpl,_std::default_delete<rc::detail::Any::IAnyImpl>_>::reset
            (&this->m_impl,(pointer)this_00);
  return (unique_ptr<rc::detail::Any::IAnyImpl,_std::default_delete<rc::detail::Any::IAnyImpl>_>)
         (unique_ptr<rc::detail::Any::IAnyImpl,_std::default_delete<rc::detail::Any::IAnyImpl>_>)
         this;
}

Assistant:

Any Any::of(T &&value) {
  Any any;
  any.m_impl.reset(new AnyImpl<Decay<T>>(std::forward<T>(value)));
  return any;
}